

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt64
          (OptionInterpreter *this,int number,int64 value,Type type,UnknownFieldSet *unknown_fields)

{
  uint64 value_00;
  LogMessage *pLVar1;
  LogFinisher local_75 [13];
  LogMessage local_68;
  UnknownFieldSet *local_30;
  UnknownFieldSet *unknown_fields_local;
  int64 iStack_20;
  Type type_local;
  int64 value_local;
  OptionInterpreter *pOStack_10;
  int number_local;
  OptionInterpreter *this_local;
  
  local_30 = unknown_fields;
  unknown_fields_local._4_4_ = type;
  iStack_20 = value;
  value_local._4_4_ = number;
  pOStack_10 = this;
  if (type == TYPE_INT64) {
    UnknownFieldSet::AddVarint(unknown_fields,number,value);
  }
  else if (type == TYPE_SFIXED64) {
    UnknownFieldSet::AddFixed64(unknown_fields,number,value);
  }
  else if (type == MAX_TYPE) {
    value_00 = internal::WireFormatLite::ZigZagEncode64(value);
    UnknownFieldSet::AddVarint(unknown_fields,number,value_00);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x19d9);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"Invalid wire type for CPPTYPE_INT64: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,unknown_fields_local._4_4_);
    internal::LogFinisher::operator=(local_75,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt64(int number, int64 value,
    FieldDescriptor::Type type, UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT64:
      unknown_fields->AddVarint(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_SFIXED64:
      unknown_fields->AddFixed64(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_SINT64:
      unknown_fields->AddVarint(number,
          google::protobuf::internal::WireFormatLite::ZigZagEncode64(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT64: " << type;
      break;
  }
}